

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,3,3,false>,Eigen::Matrix<float,3,3,0,3,3>,float,float>
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false> *dst,
               Matrix<float,_3,_3,_0,_3,_3> *src,assign_op<float,_float> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<float,_float> *param_2_local;
  Matrix<float,_3,_3,_0,_3,_3> *src_local;
  Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false> *dst_local;
  
  IVar1 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::rows
                    (&src->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>);
  cols = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::cols
                   (&src->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>);
  IVar2 = MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false>,_0>::rows
                    ((MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false>,_0> *)
                     dst);
  if (IVar2 == IVar1) {
    IVar2 = MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false>,_0>::cols
                      ((MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false>,_0> *
                       )dst);
    if (IVar2 == cols) goto LAB_002c543d;
  }
  DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false>_>::resize
            ((DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false>_> *)dst,IVar1
             ,cols);
LAB_002c543d:
  IVar2 = MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false>,_0>::rows
                    ((MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false>,_0> *)
                     dst);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false>,_0>::cols
                      ((MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false>,_0> *
                       )dst);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Block<Eigen::Matrix<float, 4, 4>, 3, 3>, SrcXprType = Eigen::Matrix<float, 3, 3>, T1 = float, T2 = float]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}